

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

void __thiscall
QInputDialogPrivate::currentRowChanged
          (QInputDialogPrivate *this,QModelIndex *newIndex,QModelIndex *param_2)

{
  QAbstractItemModel *pQVar1;
  QWidget *this_00;
  long in_FS_OFFSET;
  QString local_58;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QComboBox::model(this->comboBox);
  (**(code **)(*(long *)pQVar1 + 0x90))(&local_40,pQVar1,newIndex,0);
  ::QVariant::toString();
  textChanged(this,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  ::QVariant::~QVariant(&local_40);
  this_00 = (QWidget *)QDialogButtonBox::button((QDialogButtonBox *)this->buttonBox,FirstButton);
  QWidget::setEnabled(this_00,true);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::currentRowChanged(const QModelIndex &newIndex,
                                            const QModelIndex & /* oldIndex */)
{
    textChanged(comboBox->model()->data(newIndex).toString());
    buttonBox->button(QDialogButtonBox::Ok)->setEnabled(true);
}